

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conspage.c
# Opt level: O0

LispPTR N_OP_cons(LispPTR cons_car,LispPTR cons_cdr)

{
  LispPTR ptr;
  conspage *pcVar1;
  uint ptr_00;
  ConsCell *pCStack_20;
  LispPTR new_page;
  ConsCell *new_cell;
  conspage *new_conspage;
  LispPTR cons_cdr_local;
  LispPTR cons_car_local;
  
  ptr_00 = cons_cdr & 0xfffffff;
  if (((*(ushort *)((ulong)(MDStypetbl + (ptr_00 >> 9)) ^ 2) & 0x8000) == 0) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(ptr_00,0);
    }
    else {
      htfind(ptr_00,0);
    }
  }
  if (((*(ushort *)((ulong)(MDStypetbl + (cons_car >> 9)) ^ 2) & 0x8000) == 0) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(cons_car,0);
    }
    else {
      htfind(cons_car,0);
    }
  }
  if (ptr_00 == 0) {
    pCStack_20 = find_free_cons_cell();
    if (pCStack_20 == (ConsCell *)0x0) {
      pcVar1 = next_conspage();
      pCStack_20 = (ConsCell *)
                   ((long)&pcVar1->cell6 + (ulong)(*(uint *)&pcVar1->field_0x8 >> 0x10 & 0xff) * 2);
      *(uint *)&pcVar1->field_0x8 =
           *(uint *)&pcVar1->field_0x8 & 0xffffff |
           ((*(uint *)&pcVar1->field_0x8 >> 0x18) - 1) * 0x1000000;
      *(uint *)&pcVar1->field_0x8 =
           *(uint *)&pcVar1->field_0x8 & 0xff00ffff | ((uint)*pCStack_20 >> 0x18) << 0x10;
      *pCStack_20 = (ConsCell)((uint)*pCStack_20 & 0xf0000000 | cons_car & 0xfffffff);
      *pCStack_20 = (ConsCell)((uint)*pCStack_20 & 0xfffffff | 0x80000000);
      ListpDTD->dtd_oldcnt = ListpDTD->dtd_oldcnt + 1;
    }
    else {
      *pCStack_20 = (ConsCell)((uint)*pCStack_20 & 0xf0000000 | cons_car & 0xfffffff);
      *pCStack_20 = (ConsCell)((uint)*pCStack_20 & 0xfffffff | 0x80000000);
      ListpDTD->dtd_cnt0 = ListpDTD->dtd_cnt0 + 1;
    }
  }
  else {
    pcVar1 = (conspage *)NativeAligned4FromLPage(ptr_00 >> 8);
    if ((((*(ushort *)((ulong)(MDStypetbl + (ptr_00 >> 9)) ^ 2) & 0x7ff) == 5) &&
        (*(uint *)&pcVar1->field_0x8 >> 0x18 != 0)) &&
       (pCStack_20 = find_close_prior_cell(pcVar1,ptr_00), pCStack_20 != (ConsCell *)0x0)) {
      *pCStack_20 = (ConsCell)((uint)*pCStack_20 & 0xf0000000 | cons_car & 0xfffffff);
      ListpDTD->dtd_cnt0 = ListpDTD->dtd_cnt0 + 1;
    }
    else {
      pCStack_20 = find_cdrcodable_pair(ptr_00);
      *pCStack_20 = (ConsCell)((uint)*pCStack_20 & 0xf0000000 | cons_car & 0xfffffff);
      ListpDTD->dtd_oldcnt = ListpDTD->dtd_oldcnt + 1;
    }
  }
  ptr = LAddrFromNative(pCStack_20);
  if (((*(ushort *)((ulong)(MDStypetbl + (ptr >> 9)) ^ 2) & 0x8000) == 0) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(ptr,1);
    }
    else {
      htfind(ptr,1);
    }
  }
  if (0xfe < (ptr & 0xff) + ((uint)*pCStack_20 >> 0x1c & 7) * 2) {
    error("in CONS, cdr code too big.");
  }
  return ptr;
}

Assistant:

LispPTR N_OP_cons(LispPTR cons_car, LispPTR cons_cdr) {
  struct conspage *new_conspage;
  ConsCell *new_cell;
#ifndef NEWCDRCODING
  ConsCell *temp_cell;
#endif
  LispPTR new_page; /* hold the return  val of nextconspage */

  GCLOOKUP(cons_cdr &= POINTERMASK, ADDREF);
  GCLOOKUP(cons_car, ADDREF);

  if (cons_cdr == NIL_PTR) {
#ifdef NEWCDRCODING
    if ((new_cell = find_free_cons_cell())) { /* next page has 1 or more free cells */
#else
    if ((ListpDTD->dtd_nextpage != 0) &&
        (GetCONSCount(ListpDTD->dtd_nextpage) > 0)) { /* next page has 1 or more free cells */
      new_page = ListpDTD->dtd_nextpage;
      new_conspage = (struct conspage *)NativeAligned4FromLPage(new_page);
      if (new_conspage->next_cell == 0) error("count ne 0, but nothing on free chain.");
      new_cell = GetNewCell_68k(new_conspage); /* get new cell */

      new_conspage->count--;                                       /* decrement free cnt. */
      new_conspage->next_cell = ((freecons *)new_cell)->next_free; /* update free cell chain */
#endif /* NEWCDRCODING */

      /* filling new cell with the data */
      new_cell->car_field = cons_car;
      new_cell->cdr_code = CDR_NIL;

      ListpDTD->dtd_cnt0++;

    }      /* if (ListpDTD.. end */
    else { /* Need to get a new CONS page */
      new_conspage = next_conspage();

      new_cell = GetNewCell_68k(new_conspage);

      new_conspage->count--;                                       /* decrement free cnt. */
      new_conspage->next_cell = ((freecons *)new_cell)->next_free; /* update free cell chain */

      /* filling new cell with the data */
      new_cell->car_field = cons_car;
      new_cell->cdr_code = CDR_NIL;

      ListpDTD->dtd_oldcnt++;

    }  /* else 1 end */
  }    /* if(cons_cdr.. end */
  else /* cons_cdr != NIL */
  {
    new_page = POINTER_PAGE(cons_cdr); /* Y's page num */
    new_conspage = (struct conspage *)NativeAligned4FromLPage(new_page);
#ifdef NEWCDRCODING
    if (Listp(cons_cdr) && (new_conspage->count > 0) &&
        (new_cell = find_close_prior_cell(new_conspage, cons_cdr)))
#else
    if (Listp(cons_cdr) && (new_conspage->count > 0))
#endif /* NEWCDRCODING */
    {  /* The cdr is itself a CONS cell, and can be */
       /* represented using CDR_ONPAGE representation */

#ifndef NEWCDRCODING
      new_cell = GetNewCell_68k(new_conspage);
#ifdef DEBUG
      if (new_cell->car_field != NIL) {
        printf("CELL 0x%x has non-NIL car = 0x%x \n", LAddrFromNative(new_cell),
               new_cell->car_field);
        error("QUIT from N_OP_cons");
      }
#endif

      new_conspage->count--;                                       /* decrement free cnt. */
      new_conspage->next_cell = ((freecons *)new_cell)->next_free; /* update free cell chain */
#endif                                                             /*NEWCDRCODING */

      new_cell->car_field = cons_car;
/* cdr_onpage + cell offset in this conspage */
#ifdef NEWCDRCODING
#else
      new_cell->cdr_code = CDR_ONPAGE | ((cons_cdr & 0xff) >> 1);
#endif /* NEWCDRCODING */
      ListpDTD->dtd_cnt0++;

    } /* if (listp.. end */
    else {
/* UFN case : CDR_INDIRECT */
#ifdef NEWCDRCODING
      new_cell = find_cdrcodable_pair(cons_cdr);
#else
      new_conspage = next_conspage();

      /* get 2 cells from conspage */
      temp_cell = GetNewCell_68k(new_conspage);
#ifdef DEBUG
      if (temp_cell->car_field != NIL) {
        printf("CDR indirect CELL 0x%x has non-NIL car 0x%x \n", LAddrFromNative(new_cell),
               temp_cell->car_field);
        error("QUIT from N_OP_cons");
      }
#endif

      new_conspage->next_cell = ((freecons *)temp_cell)->next_free; /* update free cell chain */
      new_cell = GetNewCell_68k(new_conspage);
#ifdef DEBUG
      if (new_cell->car_field != NIL) {
        printf("CDR ind-2 CELL 0x%x has non-NIL car = 0x%x \n", LAddrFromNative(new_cell),
               new_cell->car_field);
        error("QUIT from N_OP_cons");
      }
#endif

      new_conspage->next_cell = ((freecons *)new_cell)->next_free; /* update free cell chain */
      new_conspage->count -= 2;                                    /* decrement free cnt. */

      /* filling cell */
      *((LispPTR *)temp_cell) = cons_cdr; /* Indirect CDR ptr */
#endif /* NEWCDRCODING */
      new_cell->car_field = cons_car;

#ifndef NEWCDRCODING
      /* culc. cdr code */
      new_cell->cdr_code = (((LispPTR)LAddrFromNative(temp_cell)) & 0xff) >> 1;
#endif /* NEWCDRCODING */

      ListpDTD->dtd_oldcnt++; /* added feb-12 take */

    } /* else end */

  } /* else (cons_cdr==NIL end) */

  new_page = LAddrFromNative(new_cell);
  GCLOOKUP(new_page, DELREF);
#ifdef NEWCDRCODING
  if (254 < ((new_page & 0xff) + ((new_cell->cdr_code & 7) << 1)))
    error("in CONS, cdr code too big.");
#endif /* NEWCDRCODING */
  return (new_page);

} /* N_OP_cons() end */

/**********************************************************************/
/* function cons same as N_OP_cons				      */
/**********************************************************************/

LispPTR cons(LispPTR cons_car, LispPTR cons_cdr) { return (N_OP_cons(cons_car, cons_cdr)); }